

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGComputeInterleaves(void *payload,void *data,xmlChar *name)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  void *pvVar7;
  undefined8 *puVar8;
  xmlRelaxNGDefinePtr_conflict *ppxVar9;
  int *piVar10;
  xmlHashTablePtr pxVar11;
  xmlRelaxNGDefinePtr_conflict *ppxVar12;
  xmlRelaxNGDefinePtr_conflict *payload_00;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_00;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_01;
  xmlRelaxNGDefinePtr_conflict *extraout_RDX_02;
  xmlRelaxNGDefinePtr_conflict *ppxVar13;
  xmlChar *pxVar14;
  void *pvVar15;
  int iVar16;
  char *key;
  size_t sVar17;
  xmlRelaxNGDefinePtr_conflict def;
  ulong uVar18;
  ulong uVar19;
  xmlRelaxNGDefinePtr_conflict *ppxVar20;
  bool bVar21;
  
  if (*(int *)((long)data + 0x44) == 0) {
    uVar18 = 0;
    sVar17 = 0;
    for (lVar6 = *(long *)((long)payload + 0x30); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x40)) {
      sVar17 = sVar17 + 8;
    }
    pvVar7 = (*xmlMalloc)(sVar17);
    if (pvVar7 != (void *)0x0) {
      def = *(xmlRelaxNGDefinePtr_conflict *)((long)payload + 0x30);
      if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
        bVar21 = true;
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        iVar16 = 0;
        do {
          puVar8 = (undefined8 *)(*xmlMalloc)(0x18);
          *(undefined8 **)((long)pvVar7 + uVar18 * 8) = puVar8;
          if (puVar8 == (undefined8 *)0x0) goto LAB_0018156f;
          iVar16 = iVar16 + (uint)(def->type == XML_RELAXNG_TEXT);
          *puVar8 = def;
          ppxVar9 = xmlRelaxNGGetElements((xmlRelaxNGParserCtxtPtr)data,def,2);
          *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar7 + uVar18 * 8) + 8) = ppxVar9;
          ppxVar9 = xmlRelaxNGGetElements((xmlRelaxNGParserCtxtPtr)data,def,1);
          *(xmlRelaxNGDefinePtr_conflict **)(*(long *)((long)pvVar7 + uVar18 * 8) + 0x10) = ppxVar9;
          uVar18 = uVar18 + 1;
          def = def->next;
        } while (def != (xmlRelaxNGDefinePtr)0x0);
        bVar21 = iVar16 == 0;
      }
      piVar10 = (int *)(*xmlMalloc)(0x20);
      if (piVar10 != (int *)0x0) {
        piVar10[0] = 0;
        piVar10[1] = 0;
        piVar10[2] = 0;
        piVar10[3] = 0;
        piVar10[4] = 0;
        piVar10[5] = 0;
        piVar10[6] = 0;
        piVar10[7] = 0;
        iVar16 = (int)uVar18;
        *piVar10 = iVar16;
        pxVar11 = xmlHashCreate(iVar16);
        *(xmlHashTablePtr *)(piVar10 + 2) = pxVar11;
        if (iVar16 == 0) {
          uVar5 = 1;
        }
        else {
          ppxVar12 = (xmlRelaxNGDefinePtr_conflict *)(uVar18 & 0xffffffff);
          payload_00 = (xmlRelaxNGDefinePtr_conflict *)0x0;
          pvVar15 = pvVar7;
          ppxVar9 = ppxVar12;
          uVar4 = 1;
          do {
            lVar6 = *(long *)((long)pvVar7 + (long)payload_00 * 8);
            payload_00 = (xmlRelaxNGDefinePtr_conflict *)((long)payload_00 + 1);
            if (payload_00 < ppxVar12) {
              ppxVar20 = (xmlRelaxNGDefinePtr_conflict *)&DAT_00000001;
              ppxVar13 = payload_00;
              do {
                lVar1 = *(long *)((long)pvVar15 + (long)ppxVar20 * 8);
                if (lVar1 != 0) {
                  iVar16 = xmlRelaxNGCompareElemDefLists
                                     (*(xmlRelaxNGParserCtxtPtr *)(lVar6 + 8),
                                      *(xmlRelaxNGDefinePtr_conflict **)(lVar1 + 8),ppxVar13);
                  ppxVar13 = extraout_RDX;
                  if (iVar16 == 0) {
                    xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),
                               0x3fd,"Element or text conflicts in interleave\n",(xmlChar *)0x0,
                               (xmlChar *)0x0);
                    ppxVar13 = extraout_RDX_00;
                  }
                  iVar16 = xmlRelaxNGCompareElemDefLists
                                     (*(xmlRelaxNGParserCtxtPtr *)(lVar6 + 0x10),
                                      *(xmlRelaxNGDefinePtr_conflict **)
                                       (*(long *)((long)pvVar15 + (long)ppxVar20 * 8) + 0x10),
                                      ppxVar13);
                  ppxVar13 = extraout_RDX_01;
                  if (iVar16 == 0) {
                    xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),
                               0x3e9,"Attributes conflicts in interleave\n",(xmlChar *)0x0,
                               (xmlChar *)0x0);
                    ppxVar13 = extraout_RDX_02;
                  }
                }
                ppxVar20 = (xmlRelaxNGDefinePtr_conflict *)((long)ppxVar20 + 1);
              } while (ppxVar9 != ppxVar20);
            }
            plVar2 = *(long **)(lVar6 + 8);
            uVar5 = 0;
            if ((plVar2 != (long *)0x0) && (uVar5 = 0, *plVar2 != 0)) {
              piVar3 = (int *)*plVar2;
              uVar5 = uVar4;
              while (piVar3 != (int *)0x0) {
                uVar4 = 0xffffffff;
                if (*piVar3 == 4) {
                  key = *(char **)(piVar3 + 4);
                  if ((xmlChar *)key != (xmlChar *)0x0) {
                    pxVar14 = *(xmlChar **)(piVar3 + 6);
                    if ((pxVar14 == (xmlChar *)0x0) || (*pxVar14 == '\0')) {
                      pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                      goto LAB_001814d1;
                    }
                    pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                    goto LAB_001814d3;
                  }
                  pxVar14 = *(xmlChar **)(piVar3 + 6);
                  if ((pxVar14 == (xmlChar *)0x0) || (*pxVar14 == '\0')) {
                    pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                    pxVar14 = (xmlChar *)0x0;
                  }
                  else {
                    pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                  }
                  iVar16 = xmlHashAddEntry2(pxVar11,"#any",pxVar14,payload_00);
                  if (*(long *)(*plVar2 + 0x50) != 0) {
                    uVar5 = 2;
                  }
LAB_001814dd:
                  uVar4 = -(uint)(iVar16 != 0) | uVar5;
                }
                else if (*piVar3 == 3) {
                  pxVar11 = *(xmlHashTablePtr *)(piVar10 + 2);
                  key = "#text";
LAB_001814d1:
                  pxVar14 = (xmlChar *)0x0;
LAB_001814d3:
                  iVar16 = xmlHashAddEntry2(pxVar11,(xmlChar *)key,pxVar14,payload_00);
                  goto LAB_001814dd;
                }
                piVar3 = (int *)plVar2[1];
                plVar2 = plVar2 + 1;
                uVar5 = uVar4;
              }
            }
            pvVar15 = (void *)((long)pvVar15 + 8);
            ppxVar9 = (xmlRelaxNGDefinePtr_conflict *)((long)ppxVar9 + -1);
            uVar4 = uVar5;
          } while (payload_00 != ppxVar12);
        }
        *(void **)(piVar10 + 6) = pvVar7;
        *(int **)((long)payload + 0x28) = piVar10;
        if (!bVar21) {
          *(byte *)((long)payload + 0x62) = *(byte *)((long)payload + 0x62) | 8;
        }
        if (uVar5 != 2) {
          if (uVar5 != 1) {
            return;
          }
          piVar10[4] = 1;
          return;
        }
        piVar10[4] = 3;
        return;
      }
    }
LAB_0018156f:
    xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)data);
    if (pvVar7 != (void *)0x0) {
      if ((int)uVar18 != 0) {
        uVar19 = 0;
        do {
          lVar6 = *(long *)((long)pvVar7 + uVar19 * 8);
          if (lVar6 != 0) {
            pvVar15 = *(void **)(lVar6 + 8);
            if (pvVar15 != (void *)0x0) {
              (*xmlFree)(pvVar15);
            }
            (*xmlFree)(*(void **)((long)pvVar7 + uVar19 * 8));
          }
          uVar19 = uVar19 + 1;
        } while ((uVar18 & 0xffffffff) != uVar19);
      }
      (*xmlFree)(pvVar7);
      return;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGComputeInterleaves(void *payload, void *data,
                             const xmlChar * name ATTRIBUTE_UNUSED)
{
    xmlRelaxNGDefinePtr def = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGDefinePtr cur, *tmp;

    xmlRelaxNGPartitionPtr partitions = NULL;
    xmlRelaxNGInterleaveGroupPtr *groups = NULL;
    xmlRelaxNGInterleaveGroupPtr group;
    int i, j, ret, res;
    int nbgroups = 0;
    int nbchild = 0;
    int is_mixed = 0;
    int is_determinist = 1;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return;

    cur = def->content;
    while (cur != NULL) {
        nbchild++;
        cur = cur->next;
    }

    groups = (xmlRelaxNGInterleaveGroupPtr *)
        xmlMalloc(nbchild * sizeof(xmlRelaxNGInterleaveGroupPtr));
    if (groups == NULL)
        goto error;
    cur = def->content;
    while (cur != NULL) {
        groups[nbgroups] = (xmlRelaxNGInterleaveGroupPtr)
            xmlMalloc(sizeof(xmlRelaxNGInterleaveGroup));
        if (groups[nbgroups] == NULL)
            goto error;
        if (cur->type == XML_RELAXNG_TEXT)
            is_mixed++;
        groups[nbgroups]->rule = cur;
        groups[nbgroups]->defs = xmlRelaxNGGetElements(ctxt, cur, 2);
        groups[nbgroups]->attrs = xmlRelaxNGGetElements(ctxt, cur, 1);
        nbgroups++;
        cur = cur->next;
    }

    /*
     * Let's check that all rules makes a partitions according to 7.4
     */
    partitions = (xmlRelaxNGPartitionPtr)
        xmlMalloc(sizeof(xmlRelaxNGPartition));
    if (partitions == NULL)
        goto error;
    memset(partitions, 0, sizeof(xmlRelaxNGPartition));
    partitions->nbgroups = nbgroups;
    partitions->triage = xmlHashCreate(nbgroups);
    for (i = 0; i < nbgroups; i++) {
        group = groups[i];
        for (j = i + 1; j < nbgroups; j++) {
            if (groups[j] == NULL)
                continue;

            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->defs,
                                                groups[j]->defs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ELEM_TEXT_CONFLICT,
                           "Element or text conflicts in interleave\n",
                           NULL, NULL);
            }
            ret = xmlRelaxNGCompareElemDefLists(ctxt, group->attrs,
                                                groups[j]->attrs);
            if (ret == 0) {
                xmlRngPErr(ctxt, def->node, XML_RNGP_ATTR_CONFLICT,
                           "Attributes conflicts in interleave\n", NULL,
                           NULL);
            }
        }
        tmp = group->defs;
        if ((tmp != NULL) && (*tmp != NULL)) {
            while (*tmp != NULL) {
                if ((*tmp)->type == XML_RELAXNG_TEXT) {
                    res = xmlHashAddEntry2(partitions->triage,
                                           BAD_CAST "#text", NULL,
                                           XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if (((*tmp)->type == XML_RELAXNG_ELEMENT) &&
                           ((*tmp)->name != NULL)) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               (*tmp)->name, (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if (res != 0)
                        is_determinist = -1;
                } else if ((*tmp)->type == XML_RELAXNG_ELEMENT) {
                    if (((*tmp)->ns == NULL) || ((*tmp)->ns[0] == 0))
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", NULL,
                                               XML_INT_TO_PTR(i + 1));
                    else
                        res = xmlHashAddEntry2(partitions->triage,
                                               BAD_CAST "#any", (*tmp)->ns,
                                               XML_INT_TO_PTR(i + 1));
                    if ((*tmp)->nameClass != NULL)
                        is_determinist = 2;
                    if (res != 0)
                        is_determinist = -1;
                } else {
                    is_determinist = -1;
                }
                tmp++;
            }
        } else {
            is_determinist = 0;
        }
    }
    partitions->groups = groups;

    /*
     * and save the partition list back in the def
     */
    def->data = partitions;
    if (is_mixed != 0)
        def->dflags |= IS_MIXED;
    if (is_determinist == 1)
        partitions->flags = IS_DETERMINIST;
    if (is_determinist == 2)
        partitions->flags = IS_DETERMINIST | IS_NEEDCHECK;
    return;

  error:
    xmlRngPErrMemory(ctxt);
    if (groups != NULL) {
        for (i = 0; i < nbgroups; i++)
            if (groups[i] != NULL) {
                if (groups[i]->defs != NULL)
                    xmlFree(groups[i]->defs);
                xmlFree(groups[i]);
            }
        xmlFree(groups);
    }
    xmlRelaxNGFreePartition(partitions);
}